

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Unpack64(int g_src,int g_dest,int g_mask,int64_t lo,int64_t hi,int64_t *icount)

{
  int64_t in_RAX;
  Integer icnt;
  int64_t local_18;
  
  local_18 = in_RAX;
  pnga_unpack((long)g_src,(long)g_dest,(long)g_mask,lo + 1,hi + 1,&local_18);
  *icount = local_18;
  return;
}

Assistant:

void GA_Unpack64(int g_src, int g_dest, int g_mask, int64_t lo, int64_t hi, int64_t *icount)
{
     Integer a = (Integer)g_src;
     Integer b = (Integer)g_dest;
     Integer s = (Integer)g_mask;
     Integer icnt;
     Integer alo = lo+1;
     Integer ahi = hi+1;
     wnga_unpack(a, b, s, alo, ahi, &icnt); 
     *icount = icnt;
}